

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O1

Sexp * GcHeap::AllocateCons(Sexp *car,Sexp *cdr)

{
  Sexp *pSVar1;
  Sexp *local_30;
  Sexp *car_local;
  Sexp *cdr_local;
  FrameProtector __frame_prot;
  
  local_30 = car;
  car_local = cdr;
  FrameProtector::FrameProtector((FrameProtector *)&cdr_local,"AllocateCons");
  FrameProtector::ProtectValue((FrameProtector *)&cdr_local,&local_30,"car");
  FrameProtector::ProtectValue((FrameProtector *)&cdr_local,&car_local,"cdr");
  if (g_heap == (GcHeap *)0x0) {
    __assert_fail("g_heap != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0xbd,"static Sexp *GcHeap::AllocateCons(Sexp *, Sexp *)");
  }
  pSVar1 = Allocate(g_heap,false);
  if (pSVar1 != (Sexp *)0x0) {
    pSVar1->kind = CONS;
    (pSVar1->field_1).cons.car = local_30;
    (pSVar1->field_1).cons.cdr = car_local;
    FrameProtector::~FrameProtector((FrameProtector *)&cdr_local);
    return pSVar1;
  }
  __assert_fail("s != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0xbf,"static Sexp *GcHeap::AllocateCons(Sexp *, Sexp *)");
}

Assistant:

static Sexp *AllocateCons(Sexp *car, Sexp *cdr) {
    GC_HELPER_FRAME;
    GC_PROTECT(car);
    GC_PROTECT(cdr);

    assert(g_heap != nullptr);
    Sexp *s = g_heap->Allocate(false);
    assert(s != nullptr);
    s->kind = Sexp::Kind::CONS;
    s->cons.car = car;
    s->cons.cdr = cdr;
    return s;
  }